

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O0

void AM_drawSubsectors(void)

{
  double dVar1;
  DFrameBuffer *pDVar2;
  DAngle DVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  TVector2<float> *pTVar8;
  undefined4 extraout_var;
  AActor *pAVar9;
  F3DFloor **ppFVar10;
  FTexture *pFVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  TAngle<double> local_368;
  int local_360;
  int local_35c;
  FTexture *local_358;
  FTexture *pic;
  TAngle<double> local_348;
  TAngle<double> local_340;
  TAngle<double> local_338;
  TAngle<double> local_330;
  lightlist_t *local_328;
  lightlist_t *light;
  TAngle<double> local_318;
  uint local_30c;
  sector_t *psStack_308;
  int selector;
  sector_t_conflict *model;
  double roverz;
  F3DFloor *rover;
  double dStack_2e8;
  uint i_1;
  double cmpz;
  double seczt;
  double seczb;
  double secy;
  double secx;
  secplane_t *floorplane;
  undefined1 local_2b0 [4];
  FTextureID maptex;
  TAngle<double> local_2a8;
  DAngle local_2a0;
  sector_t_conflict *sec;
  mpoint_t pt;
  DWORD j;
  int i;
  mpoint_t originpt;
  FDynamicColormap *colormap;
  double originy;
  double originx;
  double scaley;
  double scalex;
  int ceilinglight;
  int floorlight;
  sector_t_conflict tempsec;
  DAngle rotation;
  double scale;
  
  if ((AM_drawSubsectors()::points == '\0') &&
     (iVar5 = __cxa_guard_acquire(&AM_drawSubsectors()::points), iVar5 != 0)) {
    TArray<TVector2<float>,_TVector2<float>_>::TArray(&AM_drawSubsectors::points);
    __cxa_atexit(TArray<TVector2<float>,_TVector2<float>_>::~TArray,&AM_drawSubsectors::points,
                 &__dso_handle);
    __cxa_guard_release(&AM_drawSubsectors()::points);
  }
  dVar1 = scale_mtof;
  TAngle<double>::TAngle((TAngle<double> *)&tempsec.e);
  sector_t::sector_t((sector_t *)&ceilinglight);
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x10])();
  pt.y._4_4_ = 0;
  do {
    if (numsubsectors <= pt.y._4_4_) {
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x11])();
      return;
    }
    if ((((subsectors[pt.y._4_4_].flags & 4U) == 0) &&
        ((((subsectors[pt.y._4_4_].flags & 2U) != 0 &&
          (((subsectors[pt.y._4_4_].render_sector)->MoreFlags & 0x100) == 0)) ||
         (iVar5 = FIntCVar::operator_cast_to_int(&am_cheat), iVar5 != 0)))) &&
       (((bVar4 = FBoolCVar::operator_cast_to_bool(&am_portaloverlay), !bVar4 ||
         ((subsectors[pt.y._4_4_].render_sector)->PortalGroup == MapPortalGroup)) ||
        ((subsectors[pt.y._4_4_].render_sector)->PortalGroup == 0)))) {
      TArray<TVector2<float>,_TVector2<float>_>::Resize
                (&AM_drawSubsectors::points,subsectors[pt.y._4_4_].numlines);
      for (pt.y._0_4_ = 0; pt.y._0_4_ < subsectors[pt.y._4_4_].numlines; pt.y._0_4_ = pt.y._0_4_ + 1
          ) {
        sec = (sector_t_conflict *)vertex_t::fX(subsectors[pt.y._4_4_].firstline[pt.y._0_4_].v1);
        pt.x = vertex_t::fY(subsectors[pt.y._4_4_].firstline[pt.y._0_4_].v1);
        iVar5 = FIntCVar::operator_cast_to_int(&am_rotate);
        if ((iVar5 == 1) ||
           ((iVar5 = FIntCVar::operator_cast_to_int(&am_rotate), iVar5 == 2 &&
            ((viewactive & 1U) != 0)))) {
          AM_rotatePoint((double *)&sec,&pt.x);
        }
        dVar12 = (double)f_x;
        dVar13 = (double)sec - m_x;
        pTVar8 = TArray<TVector2<float>,_TVector2<float>_>::operator[]
                           (&AM_drawSubsectors::points,(ulong)pt.y._0_4_);
        pTVar8->X = (float)(dVar12 + dVar13 * dVar1);
        dVar12 = (double)f_y;
        dVar13 = (double)f_h;
        dVar15 = pt.x - m_y;
        pTVar8 = TArray<TVector2<float>,_TVector2<float>_>::operator[]
                           (&AM_drawSubsectors::points,(ulong)pt.y._0_4_);
        pTVar8->Y = (float)(dVar12 + (dVar13 - dVar15 * dVar1));
      }
      iVar5 = (*Renderer->_vptr_FRenderer[0x14])
                        (Renderer,subsectors[pt.y._4_4_].render_sector,&ceilinglight,
                         (long)&scalex + 4,&scalex,0);
      local_2a0.Degrees = (double)CONCAT44(extraout_var,iVar5);
      dVar12 = sector_t::GetXOffset((sector_t *)local_2a0.Degrees,0);
      _j = -dVar12;
      originpt.x = sector_t::GetYOffset(local_2a0.Degrees,0,true);
      sector_t::GetAngle((sector_t *)local_2b0,SUB84(local_2a0.Degrees,0),false);
      TAngle<double>::operator-(&local_2a8);
      TAngle<double>::operator=((TAngle<double> *)&tempsec.e,&local_2a8);
      originpt.y = *(double *)((long)local_2a0.Degrees + 0x100);
      floorplane._4_4_ = sector_t::GetTexture((sector_t *)local_2a0.Degrees,0);
      scaley = sector_t::GetXScale(local_2a0.Degrees,0);
      originx = sector_t::GetYScale(local_2a0.Degrees,0);
      uVar6 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                        ((TArray<F3DFloor_*,_F3DFloor_*> *)
                         &(*(extsector_t **)((long)local_2a0.Degrees + 0x210))->XFloor);
      if (uVar6 != 0) {
        secx = local_2a0.Degrees + 0xb0;
        dStack_2e8 = ViewPos.Z;
        pAVar9 = TObjPtr::operator_cast_to_AActor_
                           ((TObjPtr *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
        DVar3.Degrees = local_2a0.Degrees;
        if ((pAVar9 == (AActor *)0x0) ||
           (pAVar9 = TObjPtr<AActor>::operator->
                               ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0)),
           (sector_t_conflict *)DVar3.Degrees != (sector_t_conflict *)pAVar9->Sector)) {
          secy = ((DVector2 *)((long)local_2a0.Degrees + 0x120))->X;
          seczb = *(double *)((long)local_2a0.Degrees + 0x128);
        }
        else {
          secy = ViewPos.X;
          seczb = ViewPos.Y;
        }
        seczt = secplane_t::ZatPoint((secplane_t *)secx,secy,seczb);
        cmpz = secplane_t::ZatPoint((secplane_t *)((long)local_2a0.Degrees + 0xd8),secy,seczb);
        for (rover._4_4_ = 0; uVar6 = rover._4_4_,
            uVar7 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)
                               &(*(extsector_t **)((long)local_2a0.Degrees + 0x210))->XFloor),
            uVar6 < uVar7; rover._4_4_ = rover._4_4_ + 1) {
          ppFVar10 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                               ((TArray<F3DFloor_*,_F3DFloor_*> *)
                                &(*(extsector_t **)((long)local_2a0.Degrees + 0x210))->XFloor,
                                (ulong)rover._4_4_);
          roverz = (double)*ppFVar10;
          if (((((((F3DFloor *)roverz)->flags & 1) != 0) &&
               ((((F3DFloor *)roverz)->flags & 0x1000) == 0)) &&
              ((((F3DFloor *)roverz)->flags & 8) != 0)) &&
             ((((F3DFloor *)roverz)->alpha != 0 &&
              (model = (sector_t_conflict *)
                       secplane_t::ZatPoint((((F3DFloor *)roverz)->top).plane,secy,seczb),
              (double)model <= cmpz)))) {
            if ((double)model < seczt) break;
            if ((double)model < dStack_2e8) {
              floorplane._4_4_ = **(int **)((long)roverz + 0x30);
              secx = *(double *)((long)roverz + 0x28);
              psStack_308 = *(sector_t **)((long)roverz + 0x38);
              bVar4 = (*(uint *)((long)roverz + 0x58) & 0x2000) == 0;
              local_30c = (uint)bVar4;
              sector_t::GetAngle((sector_t *)&light,(int)psStack_308,bVar4);
              TAngle<double>::operator-(&local_318);
              TAngle<double>::operator=((TAngle<double> *)&tempsec.e,&local_318);
              scaley = sector_t::GetXScale(psStack_308,local_30c);
              originx = sector_t::GetYScale(psStack_308,local_30c);
              dVar12 = sector_t::GetXOffset(psStack_308,local_30c);
              _j = -dVar12;
              originpt.x = sector_t::GetYOffset(psStack_308,local_30c,true);
              break;
            }
          }
        }
        local_328 = P_GetPlaneLight((sector_t_conflict *)local_2a0.Degrees,(secplane_t *)secx,false)
        ;
        scalex._4_4_ = (int)*local_328->p_lightlevel;
        originpt.y = (double)local_328->extra_colormap;
      }
      bVar4 = FTextureID::operator==((FTextureID *)((long)&floorplane + 4),&skyflatnum);
      if (!bVar4) {
        bVar4 = TAngle<double>::operator!=((TAngle<double> *)&tempsec.e,0.0);
        if (bVar4) {
          TAngle<double>::TAngle(&local_330,(TAngle<double> *)&tempsec.e);
          AM_rotate((double *)&j,&originpt.x,&local_330);
        }
        iVar5 = FIntCVar::operator_cast_to_int(&am_rotate);
        if ((iVar5 == 1) ||
           ((iVar5 = FIntCVar::operator_cast_to_int(&am_rotate), iVar5 == 2 &&
            ((viewactive & 1U) != 0)))) {
          TAngle<double>::operator+(&local_340,90.0);
          pAVar9 = TObjPtr<AActor>::operator->
                             ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
          TAngle<double>::TAngle(&local_348,&(pAVar9->Angles).Yaw);
          TAngle<double>::operator-(&local_338,&local_340);
          TAngle<double>::operator=((TAngle<double> *)&tempsec.e,&local_338);
          AM_rotatePoint((double *)&j,&originpt.x);
        }
        dVar12 = (double)f_x;
        dVar15 = _j - m_x;
        dVar13 = (double)f_y;
        dVar14 = (double)f_h;
        dVar16 = originpt.x - m_y;
        if ((subsectors[pt.y._4_4_].flags & 2U) == 0) {
          PalEntry::PalEntry((PalEntry *)((long)&pic + 4),
                             (*(byte *)((long)originpt.y + 10) + 0xff) / 2 << 0x10 |
                             (*(byte *)((long)originpt.y + 9) + 200) / 2 << 8 |
                             (*(byte *)((long)originpt.y + 8) + 0xa0) / 2);
          pic._0_4_ = (anon_union_4_2_12391d7c_for_PalEntry_0)
                      *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
                       &((anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)originpt.y + 0xc))->
                        field_0;
          originpt.y = (double)GetSpecialLights((PalEntry)pic._4_4_,(PalEntry)pic._0_4_,
                                                0xff - (0xff - *(int *)((long)originpt.y + 0x10)) /
                                                       4);
          scalex._4_4_ = (scalex._4_4_ + 3000) / 0x10;
        }
        local_35c = floorplane._4_4_;
        local_358 = FTextureManager::operator()(&TexMan,floorplane._4_4_,false);
        pDVar2 = screen;
        if ((local_358 != (FTexture *)0x0) && (local_358->UseType != '\r')) {
          local_360 = floorplane._4_4_;
          pFVar11 = FTextureManager::operator()(&TexMan,floorplane._4_4_,false);
          pTVar8 = TArray<TVector2<float>,_TVector2<float>_>::operator[]
                             (&AM_drawSubsectors::points,0);
          uVar6 = TArray<TVector2<float>,_TVector2<float>_>::Size(&AM_drawSubsectors::points);
          TAngle<double>::TAngle(&local_368,(TAngle<double> *)&tempsec.e);
          (*(pDVar2->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x12])
                    (dVar12 + dVar15 * dVar1,dVar13 + (dVar14 - dVar16 * dVar1),dVar1 / scaley,
                     dVar1 / originx,pDVar2,pFVar11,pTVar8,(ulong)uVar6,&local_368,originpt.y,
                     scalex._4_4_,f_y + f_h);
        }
      }
    }
    pt.y._4_4_ = pt.y._4_4_ + 1;
  } while( true );
}

Assistant:

void AM_drawSubsectors()
{
	static TArray<FVector2> points;
	double scale = scale_mtof;
	DAngle rotation;
	sector_t tempsec;
	int floorlight, ceilinglight;
	double scalex, scaley;
	double originx, originy;
	FDynamicColormap *colormap;
	mpoint_t originpt;

	screen->StartSimplePolys();
	for (int i = 0; i < numsubsectors; ++i)
	{
		if (subsectors[i].flags & SSECF_POLYORG)
		{
			continue;
		}

		if ((!(subsectors[i].flags & SSECF_DRAWN) || (subsectors[i].render_sector->MoreFlags & SECF_HIDDEN)) && am_cheat == 0)
		{
			continue;
		}

		if (am_portaloverlay && subsectors[i].render_sector->PortalGroup != MapPortalGroup && subsectors[i].render_sector->PortalGroup != 0)
		{
			continue;
		}

		// Fill the points array from the subsector.
		points.Resize(subsectors[i].numlines);
		for (DWORD j = 0; j < subsectors[i].numlines; ++j)
		{
			mpoint_t pt = { subsectors[i].firstline[j].v1->fX(),
							subsectors[i].firstline[j].v1->fY() };
			if (am_rotate == 1 || (am_rotate == 2 && viewactive))
			{
				AM_rotatePoint(&pt.x, &pt.y);
			}
			points[j].X = float(f_x + ((pt.x - m_x) * scale));
			points[j].Y = float(f_y + (f_h - (pt.y - m_y) * scale));
		}
		// For lighting and texture determination
		sector_t *sec = Renderer->FakeFlat(subsectors[i].render_sector, &tempsec, &floorlight, &ceilinglight, false);
		// Find texture origin.
		originpt.x = -sec->GetXOffset(sector_t::floor);
		originpt.y = sec->GetYOffset(sector_t::floor);
		rotation = -sec->GetAngle(sector_t::floor);
		// Coloring for the polygon
		colormap = sec->ColorMap;

		FTextureID maptex = sec->GetTexture(sector_t::floor);

		scalex = sec->GetXScale(sector_t::floor);
		scaley = sec->GetYScale(sector_t::floor);

		if (sec->e->XFloor.ffloors.Size())
		{
			secplane_t *floorplane = &sec->floorplane;

			// Look for the highest floor below the camera viewpoint.
			// Check the center of the subsector's sector. Do not check each
			// subsector separately because that might result in different planes for
			// different subsectors of the same sector which is not wanted here.
			// (Make the comparison in floating point to avoid overflows and improve performance.)
			double secx;
			double secy;
			double seczb, seczt;
			double cmpz = ViewPos.Z;

			if (players[consoleplayer].camera && sec == players[consoleplayer].camera->Sector)
			{
				// For the actual camera sector use the current viewpoint as reference.
				secx = ViewPos.X;
				secy = ViewPos.Y;
			}
			else
			{
				secx = sec->centerspot.X;
				secy = sec->centerspot.Y;
			}
			seczb = floorplane->ZatPoint(secx, secy);
			seczt = sec->ceilingplane.ZatPoint(secx, secy);

			for (unsigned int i = 0; i < sec->e->XFloor.ffloors.Size(); ++i)
			{
				F3DFloor *rover = sec->e->XFloor.ffloors[i];
				if (!(rover->flags & FF_EXISTS)) continue;
				if (rover->flags & FF_FOG) continue;
				if (!(rover->flags & FF_RENDERPLANES)) continue;
				if (rover->alpha == 0) continue;
				double roverz = rover->top.plane->ZatPoint(secx, secy);
				// Ignore 3D floors that are above or below the sector itself:
				// they are hidden. Since 3D floors are sorted top to bottom,
				// if we get below the sector floor, we can stop.
				if (roverz > seczt) continue;
				if (roverz < seczb) break;
				if (roverz < cmpz)
				{
					maptex = *(rover->top.texture);
					floorplane = rover->top.plane;
					sector_t *model = rover->top.model;
					int selector = (rover->flags & FF_INVERTPLANES) ? sector_t::floor : sector_t::ceiling;
					rotation = -model->GetAngle(selector);
					scalex = model->GetXScale(selector);
					scaley = model->GetYScale(selector);
					originpt.x = -model->GetXOffset(selector);
					originpt.y = model->GetYOffset(selector);
					break;
				}
			}

			lightlist_t *light = P_GetPlaneLight(sec, floorplane, false);
			floorlight = *light->p_lightlevel;
			colormap = light->extra_colormap;
		}
		if (maptex == skyflatnum)
		{
			continue;
		}

		// Apply the floor's rotation to the texture origin.
		if (rotation != 0)
		{
			AM_rotate(&originpt.x, &originpt.y, rotation);
		}
		// Apply the automap's rotation to the texture origin.
		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			rotation = rotation + 90. - players[consoleplayer].camera->Angles.Yaw;
			AM_rotatePoint(&originpt.x, &originpt.y);
		}
		originx = f_x + ((originpt.x - m_x) * scale);
		originy = f_y + (f_h - (originpt.y - m_y) * scale);

		// If this subsector has not actually been seen yet (because you are cheating
		// to see it on the map), tint and desaturate it.
		if (!(subsectors[i].flags & SSECF_DRAWN))
		{
			colormap = GetSpecialLights(
				MAKERGB(
					(colormap->Color.r + 255) / 2,
					(colormap->Color.g + 200) / 2,
					(colormap->Color.b + 160) / 2),
				colormap->Fade,
				255 - (255 - colormap->Desaturate) / 4);
			floorlight = (floorlight + 200 * 15) / 16;
		}

		// Draw the polygon.
		FTexture *pic = TexMan(maptex);
		if (pic != NULL && pic->UseType != FTexture::TEX_Null)
		{
			screen->FillSimplePoly(TexMan(maptex),
				&points[0], points.Size(),
				originx, originy,
				scale / scalex,
				scale / scaley,
				rotation,
				colormap,
				floorlight,
				f_y + f_h
				);
		}
	}
	screen->FinishSimplePolys();
}